

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalserver.cpp
# Opt level: O0

int __thiscall QLocalServer::close(QLocalServer *this,int __fd)

{
  bool bVar1;
  QLocalServerPrivate *this_00;
  undefined7 extraout_var;
  QLocalServerPrivate *d;
  QLocalServerPrivate *pQVar2;
  
  this_00 = d_func((QLocalServer *)0x37c36b);
  bVar1 = isListening((QLocalServer *)this_00);
  pQVar2 = (QLocalServerPrivate *)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    qDeleteAll<QQueue<QLocalSocket*>>((QQueue<QLocalSocket_*> *)this_00);
    QList<QLocalSocket_*>::clear((QList<QLocalSocket_*> *)this_00);
    QLocalServerPrivate::closeServer(this_00);
    QString::clear((QString *)this_00);
    QString::clear((QString *)this_00);
    pQVar2 = this_00;
    QString::clear((QString *)this_00);
    pQVar2->error = UnknownSocketError;
  }
  return (int)pQVar2;
}

Assistant:

void QLocalServer::close()
{
    Q_D(QLocalServer);
    if (!isListening())
        return;
    qDeleteAll(d->pendingConnections);
    d->pendingConnections.clear();
    d->closeServer();
    d->serverName.clear();
    d->fullServerName.clear();
    d->errorString.clear();
    d->error = QAbstractSocket::UnknownSocketError;
}